

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

Abc_Obj_t * Io_ReadCreateNode(Abc_Ntk_t *pNtk,char *pNameOut,char **pNamesIn,int nInputs)

{
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar1;
  int local_3c;
  int i;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNet;
  int nInputs_local;
  char **pNamesIn_local;
  char *pNameOut_local;
  Abc_Ntk_t *pNtk_local;
  
  pFanin = Abc_NtkCreateNode(pNtk);
  for (local_3c = 0; local_3c < nInputs; local_3c = local_3c + 1) {
    pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pNamesIn[local_3c]);
    Abc_ObjAddFanin(pFanin,pAVar1);
  }
  pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pNameOut);
  Abc_ObjAddFanin(pAVar1,pFanin);
  return pFanin;
}

Assistant:

Abc_Obj_t * Io_ReadCreateNode( Abc_Ntk_t * pNtk, char * pNameOut, char * pNamesIn[], int nInputs )
{
    Abc_Obj_t * pNet, * pNode;
    int i;
    // create a new node 
    pNode = Abc_NtkCreateNode( pNtk );
    // add the fanin nets
    for ( i = 0; i < nInputs; i++ )
    {
        pNet = Abc_NtkFindOrCreateNet( pNtk, pNamesIn[i] );
        Abc_ObjAddFanin( pNode, pNet );
    }
    // add the fanout net
    pNet = Abc_NtkFindOrCreateNet( pNtk, pNameOut );
    Abc_ObjAddFanin( pNet, pNode );
    return pNode;
}